

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
operator<<(basic_ostream<char,_std::char_traits<char>_> *out,args<double,_2UL> *x)

{
  array<double,_2UL> *paVar1;
  const_reference pvVar2;
  array<double,_2UL> *in_RSI;
  ostream *in_RDI;
  size_t i;
  ostream *this;
  array<double,_2UL> *this_00;
  array<double,_2UL> *local_18;
  
  local_18 = (array<double,_2UL> *)0x0;
  while( true ) {
    this_00 = local_18;
    paVar1 = (array<double,_2UL> *)std::array<double,_2UL>::size(in_RSI);
    if (paVar1 <= this_00) break;
    this = in_RDI;
    pvVar2 = std::array<double,_2UL>::operator[](this_00,(size_type)in_RDI);
    std::ostream::operator<<(this,*pvVar2);
    if ((undefined1 *)((long)local_18->_M_elems + 1U) < (undefined1 *)0x2) {
      std::operator<<(in_RDI,", ");
    }
    local_18 = (array<double,_2UL> *)((long)local_18->_M_elems + 1);
  }
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<CharT, TraitT> &operator<<(std::basic_ostream<CharT, TraitT> &out,
                                                       const args &x) {
    for (std::size_t i{0}; i < x.size(); ++i) {
      out << x[i];
      if (i + 1 < n)
        out << ", ";
    }
    return out;
  }